

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ConvertRemoteHandleToLocal
          (CSharedMemoryObjectManager *this,CPalThread *pthr,RHANDLE rhRemote,HANDLE *phLocal)

{
  DWORD DVar1;
  int iVar2;
  PAL_ERROR PVar3;
  SHMObjData *psmod;
  CSharedMemoryObject *pCVar4;
  PLIST_ENTRY ple;
  undefined1 auStack_70 [8];
  CObjectAttributes oa;
  CSharedMemoryObject *local_38;
  CSharedMemoryObject *pshmobj;
  
  local_38 = (CSharedMemoryObject *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x524);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phLocal == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x525);
    fprintf(_stderr,"Expression: NULL != phLocal\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (rhRemote + 1 < (RHANDLE)0x2) {
      PVar3 = 6;
    }
    else {
      oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)&this->m_csListLock;
      InternalEnterCriticalSection(pthr,(PCRITICAL_SECTION)oa.pSecurityAttributes);
      SHMLock();
      psmod = (SHMObjData *)SHMPtrToPtr((SHMPTR)rhRemote);
      if (psmod == (SHMObjData *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013470f;
        PVar3 = 6;
      }
      else {
        DVar1 = psmod->dwNameLength;
        ple = &this->m_leNamedObjects + (DVar1 == 0);
        while (ple = ple->Flink, ple != &this->m_leNamedObjects + (DVar1 == 0)) {
          pCVar4 = CSharedMemoryObject::GetObjectFromListLink(ple);
          local_38 = pCVar4;
          iVar2 = (*(pCVar4->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[9])(pCVar4);
          if ((iVar2 == 1) && ((RHANDLE)pCVar4->m_shmod == rhRemote)) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013470f;
            iVar2 = psmod->lProcessRefCount + -1;
            psmod->lProcessRefCount = iVar2;
            if (iVar2 < 1) {
              fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                      ,0x565);
              fprintf(_stderr,"Expression: 0 < psmod->lProcessRefCount\n");
            }
            (*(pCVar4->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[7])(pCVar4);
            goto LAB_00134667;
          }
          local_38 = (CSharedMemoryObject *)0x0;
        }
        auStack_70 = (undefined1  [8])0x0;
        oa.sObjectName.m_pwsz = (WCHAR *)0x0;
        oa.sObjectName.m_dwStringLength = 0;
        oa.sObjectName.m_dwMaxLength = 0;
        if (CObjectType::s_rgotIdMapping[psmod->eTypeId] == (CObjectType *)0x0) {
          PVar3 = 0;
          fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x580);
          fprintf(_stderr,"Invalid object type ID in shared memory info\n");
        }
        else {
          PVar3 = ImportSharedObjectIntoProcess
                            (this,pthr,CObjectType::s_rgotIdMapping[psmod->eTypeId],
                             (CObjectAttributes *)auStack_70,(SHMPTR)rhRemote,psmod,false,&local_38)
          ;
          pCVar4 = local_38;
          if (PVar3 == 0) {
LAB_00134667:
            PVar3 = (**(code **)(*(long *)this + 0x18))(this,pthr,pCVar4,0,0,0,phLocal);
          }
        }
      }
      SHMRelease();
      InternalLeaveCriticalSection(pthr,(PCRITICAL_SECTION)oa.pSecurityAttributes);
      if (local_38 != (CSharedMemoryObject *)0x0) {
        (*(local_38->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[8])(local_38,pthr);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar3;
    }
  }
LAB_0013470f:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ConvertRemoteHandleToLocal(
    CPalThread *pthr,
    RHANDLE rhRemote,
    HANDLE *phLocal
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod;
    CSharedMemoryObject *pshmobj = NULL;
    PLIST_ENTRY pleObjectList;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phLocal);

    ENTRY("CSharedMemoryObjectManager::ConvertRemoteHandleToLocal "
        "(this=%p, pthr=%p, rhRemote=%p, phLocal=%p)\n",
        this,
        pthr,
        rhRemote,
        phLocal
        );

    if (rhRemote == NULL || rhRemote == INVALID_HANDLE_VALUE)
    {
        palError = ERROR_INVALID_HANDLE;
        goto ConvertRemoteHandleToLocalExitNoLockRelease;
    }

    InternalEnterCriticalSection(pthr, &m_csListLock);
    SHMLock();

    //
    // The remote handle is really a shared memory pointer to the
    // SHMObjData for the object.
    //

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, reinterpret_cast<SHMPTR>(rhRemote));
    if (NULL == psmod)
    {
        ERROR("Invalid remote handle\n");
        palError = ERROR_INVALID_HANDLE;
        goto ConvertRemoteHandleToLocalExit;
    }

    //
    // Check to see if a local reference for this object already
    // exists
    //

    if (0 != psmod->dwNameLength)
    {
        pleObjectList = &m_leNamedObjects;
    }
    else
    {
        pleObjectList = &m_leAnonymousObjects;
    }

    for (PLIST_ENTRY ple = pleObjectList->Flink;
         ple != pleObjectList;
         ple = ple->Flink)
    {
        pshmobj = CSharedMemoryObject::GetObjectFromListLink(ple);

        if (SharedObject == pshmobj->GetObjectDomain()
            && reinterpret_cast<SHMPTR>(rhRemote) == pshmobj->GetShmObjData())
        {
            TRACE("Object for remote handle already present in this process\n");
            
            //
            // PAL_LocalHandleToRemote bumped up the process refcount on the
            // object. Since this process already had a reference to the object
            // we need to decrement that reference now...
            //

            psmod->lProcessRefCount -= 1;
            _ASSERTE(0 < psmod->lProcessRefCount);

            //
            // We also need to add a reference to the object (since ReleaseReference
            // gets called below)
            //

            pshmobj->AddReference();

            break;
        }

        pshmobj = NULL;
    }

    if (NULL == pshmobj)
    {
        CObjectType *pot;
        CObjectAttributes oa;
        
        //
        // Get the local instance of the CObjectType
        //
        
        pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto ConvertRemoteHandleToLocalExit;
        }
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            reinterpret_cast<SHMPTR>(rhRemote),
            psmod,
            FALSE,
            &pshmobj
            );

        if (NO_ERROR != palError)
        {
            goto ConvertRemoteHandleToLocalExit;
        }        
    }

    //
    // Finally, allocate a local handle for the object
    //

    palError = ObtainHandleForObject(
        pthr,
        pshmobj,
        0,
        FALSE,
        NULL,
        phLocal
        );
        
ConvertRemoteHandleToLocalExit:

    SHMRelease();
    InternalLeaveCriticalSection(pthr, &m_csListLock);

ConvertRemoteHandleToLocalExitNoLockRelease:

    if (NULL != pshmobj)
    {
        pshmobj->ReleaseReference(pthr);
    }

    LOGEXIT("CSharedMemoryObjectManager::ConvertRemoteHandleToLocal returns %d\n", palError);

    return palError;
}